

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

void __thiscall icu_63::UnicodeString::setToBogus(UnicodeString *this)

{
  UnicodeString *this_local;
  
  releaseArray(this);
  (this->fUnion).fStackFields.fLengthAndFlags = 1;
  (this->fUnion).fFields.fArray = (char16_t *)0x0;
  (this->fUnion).fFields.fCapacity = 0;
  return;
}

Assistant:

void
UnicodeString::setToBogus()
{
  releaseArray();

  fUnion.fFields.fLengthAndFlags = kIsBogus;
  fUnion.fFields.fArray = 0;
  fUnion.fFields.fCapacity = 0;
}